

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMemShallowCopy(Mem *pTo,Mem *pFrom,int srcType)

{
  undefined2 uVar1;
  u16 uVar2;
  u8 uVar3;
  u8 uVar4;
  int iVar5;
  
  if ((pTo->flags & 0x2400) == 0) {
    pTo->z = pFrom->z;
    uVar2 = pFrom->flags;
    uVar3 = pFrom->enc;
    uVar4 = pFrom->eSubtype;
    iVar5 = pFrom->n;
    pTo->u = pFrom->u;
    pTo->flags = uVar2;
    pTo->enc = uVar3;
    pTo->eSubtype = uVar4;
    pTo->n = iVar5;
    if ((pFrom->flags & 0x800) == 0) {
      uVar1 = pTo->flags;
      pTo->flags = uVar1 & 0xe3ff | (ushort)srcType;
    }
    return;
  }
  vdbeMemClearExternAndSetNull(pTo);
  sqlite3VdbeMemShallowCopy(pTo,pFrom,srcType);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemShallowCopy(Mem *pTo, const Mem *pFrom, int srcType){
  assert( !sqlite3VdbeMemIsRowSet(pFrom) );
  assert( pTo->db==pFrom->db );
  if( VdbeMemDynamic(pTo) ){ vdbeClrCopy(pTo,pFrom,srcType); return; }
  memcpy(pTo, pFrom, MEMCELLSIZE);
  if( (pFrom->flags&MEM_Static)==0 ){
    pTo->flags &= ~(MEM_Dyn|MEM_Static|MEM_Ephem);
    assert( srcType==MEM_Ephem || srcType==MEM_Static );
    pTo->flags |= srcType;
  }
}